

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall
SQCompiler::EmitCompoundArith(SQCompiler *this,SQInteger tok,SQInteger etype,SQInteger pos)

{
  SQOpcode SVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQFuncState *pSVar6;
  byte bVar7;
  SQInstruction local_40;
  SQInteger local_38;
  
  if (1 < etype - 2U) {
    if (etype != 5) {
      if (etype != 4) {
        return;
      }
      SVar2 = SQFuncState::PopTarget(this->_fs);
      SVar3 = SQFuncState::PopTarget(this->_fs);
      SQFuncState::PushTarget(this->_fs,SVar3);
      pSVar6 = this->_fs;
      SVar1 = ChooseArithOpByToken(this,tok);
      local_40.op = (uchar)SVar1;
      local_40._arg0 = (uchar)SVar3;
      local_40._arg1 = (SQInt32)SVar2;
      local_40._arg3 = '\0';
      local_40._arg2 = local_40._arg0;
      SQFuncState::AddInstruction(pSVar6,&local_40);
      this->_fs->_optimization = false;
      return;
    }
    local_38 = SQFuncState::TopTarget(this->_fs);
    SVar2 = SQFuncState::PushTarget(this->_fs,-1);
    local_40.op = ' ';
    bVar7 = (byte)SVar2;
    local_40._arg2 = '\0';
    local_40._arg3 = '\0';
    local_40._arg1 = (uint)pos;
    local_40._arg0 = bVar7;
    SQFuncState::AddInstruction(this->_fs,&local_40);
    pSVar6 = this->_fs;
    SVar1 = ChooseArithOpByToken(this,tok);
    local_40.op = (uchar)SVar1;
    local_40._arg1 = (SQInt32)local_38;
    local_40._arg3 = '\0';
    local_40._arg2 = bVar7;
    local_40._arg0 = bVar7;
    SQFuncState::AddInstruction(pSVar6,&local_40);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PopTarget(this->_fs);
    pSVar6 = this->_fs;
    SVar2 = SQFuncState::PushTarget(pSVar6,-1);
    local_40.op = '\x1f';
    local_40._arg0 = (uchar)SVar2;
    local_40._arg3 = '\0';
    local_40._arg1 = (uint)pos;
    goto LAB_00119f87;
  }
  SVar2 = SQFuncState::PopTarget(this->_fs);
  SVar3 = SQFuncState::PopTarget(this->_fs);
  SVar4 = SQFuncState::PopTarget(this->_fs);
  pSVar6 = this->_fs;
  SVar5 = SQFuncState::PushTarget(pSVar6,-1);
  local_40._arg1 = (uint)(SVar4 << 0x10) | (uint)SVar2;
  if (tok < 0x13d) {
    if (tok == 0x121) {
      local_40._arg3 = 0x2b;
    }
    else {
      local_40._arg3 = 0x2d;
      if (tok != 0x122) {
LAB_00119f63:
        local_40._arg3 = 0;
      }
    }
  }
  else if (tok == 0x13d) {
    local_40._arg3 = 0x2a;
  }
  else if (tok == 0x13e) {
    local_40._arg3 = 0x2f;
  }
  else {
    if (tok != 0x13f) goto LAB_00119f63;
    local_40._arg3 = 0x25;
  }
  local_40.op = '#';
  local_40._arg0 = (uchar)SVar5;
  local_40._arg2 = (char)SVar3;
LAB_00119f87:
  SQFuncState::AddInstruction(pSVar6,&local_40);
  return;
}

Assistant:

void EmitCompoundArith(SQInteger tok, SQInteger etype, SQInteger pos)
    {
        /* Generate code depending on the expression type */
        switch(etype) {
        case LOCAL:{
            SQInteger p2 = _fs->PopTarget(); //src in OP_GET
            SQInteger p1 = _fs->PopTarget(); //key in OP_GET
            _fs->PushTarget(p1);
            //EmitCompArithLocal(tok, p1, p1, p2);
            _fs->AddInstruction(ChooseArithOpByToken(tok),p1, p2, p1, 0);
            _fs->SnoozeOpt();
                   }
            break;
        case OBJECT:
        case BASE:
            {
                SQInteger val = _fs->PopTarget();
                SQInteger key = _fs->PopTarget();
                SQInteger src = _fs->PopTarget();
                /* _OP_COMPARITH mixes dest obj and source val in the arg1 */
                _fs->AddInstruction(_OP_COMPARITH, _fs->PushTarget(), (src<<16)|val, key, ChooseCompArithCharByToken(tok));
            }
            break;
        case OUTER:
            {
                SQInteger val = _fs->TopTarget();
                SQInteger tmp = _fs->PushTarget();
                _fs->AddInstruction(_OP_GETOUTER,   tmp, pos);
                _fs->AddInstruction(ChooseArithOpByToken(tok), tmp, val, tmp, 0);
                _fs->PopTarget();
                _fs->PopTarget();
                _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, tmp);
            }
            break;
        }
    }